

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O0

void __thiscall
amrex::MFIter::MFIter(MFIter *this,BoxArray *ba,DistributionMapping *dm,MFItInfo *info)

{
  int iVar1;
  type pFVar2;
  byte *in_RCX;
  MFIter *in_RDI;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar3;
  MFIter *this_00;
  int *in_stack_ffffffffffffffb8;
  FabArrayBase **ppFVar4;
  DistributionMapping *in_stack_ffffffffffffffc0;
  BoxArray *in_stack_ffffffffffffffc8;
  
  this_00 = in_RDI;
  std::
  make_unique<amrex::FabArrayBase,amrex::BoxArray_const&,amrex::DistributionMapping_const&,int,int>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (int *)in_RDI);
  ppFVar4 = &this_00->fabArray;
  pFVar2 = std::unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>::
           operator*((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  *ppFVar4 = pFVar2;
  *(undefined8 *)(in_RDI->tile_size).vect = *(undefined8 *)(in_RCX + 8);
  (in_RDI->tile_size).vect[2] = *(int *)(in_RCX + 0x10);
  in_RDI->flags = (*in_RCX & 1) != 0;
  in_RDI->streams = *(int *)(in_RCX + 4);
  IndexType::IndexType(&in_RDI->typ);
  uVar3 = false;
  if ((in_RCX[1] & 1) != 0) {
    iVar1 = OpenMP::get_num_threads();
    uVar3 = 1 < iVar1;
  }
  in_RDI->dynamic = (bool)uVar3;
  DeviceSync::DeviceSync(&in_RDI->device_sync,(bool)(in_RCX[2] & 1));
  in_RDI->index_map = (Vector<int,_std::allocator<int>_> *)0x0;
  in_RDI->local_index_map = (Vector<int,_std::allocator<int>_> *)0x0;
  in_RDI->tile_array = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x0;
  in_RDI->local_tile_index_map = (Vector<int,_std::allocator<int>_> *)0x0;
  in_RDI->num_local_tiles = (Vector<int,_std::allocator<int>_> *)0x0;
  std::unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>::operator->
            ((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)0x1030274
            );
  FabArrayBase::addThisBD((FabArrayBase *)CONCAT17(uVar3,in_stack_ffffffffffffffa0));
  Initialize(this_00);
  return;
}

Assistant:

MFIter::MFIter (const BoxArray& ba, const DistributionMapping& dm, const MFItInfo& info)
    :
    m_fa(std::make_unique<FabArrayBase>(ba, dm, 1, 0)),
    fabArray(*m_fa),
    tile_size(info.tilesize),
    flags(info.do_tiling ? Tiling : 0),
    streams(info.num_streams),
    dynamic(info.dynamic && (OpenMP::get_num_threads() > 1)),
    device_sync(info.device_sync),
    index_map(nullptr),
    local_index_map(nullptr),
    tile_array(nullptr),
    local_tile_index_map(nullptr),
    num_local_tiles(nullptr)
{
#ifdef AMREX_USE_OMP
#pragma omp single
#endif
    {
        m_fa->addThisBD();
    }
#ifdef AMREX_USE_OMP
    if (dynamic) {
#pragma omp barrier
#pragma omp single
        nextDynamicIndex = omp_get_num_threads();
        // yes omp single has an implicit barrier and we need it because nextDynamicIndex is static.
    }
#endif

    Initialize();
}